

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O0

void __thiscall UDMFParser::UDMFParser(UDMFParser *this,FMissingTextureTracker *missing)

{
  FMissingTextureTracker *missing_local;
  UDMFParser *this_local;
  
  UDMFParserBase::UDMFParserBase(&this->super_UDMFParserBase);
  TArray<line_t,_line_t>::TArray(&this->ParsedLines);
  TArray<side_t,_side_t>::TArray(&this->ParsedSides);
  TArray<intmapsidedef_t,_intmapsidedef_t>::TArray(&this->ParsedSideTextures);
  TArray<sector_t,_sector_t>::TArray(&this->ParsedSectors);
  TArray<vertex_t,_vertex_t>::TArray(&this->ParsedVertices);
  TArray<vertexdata_t,_vertexdata_t>::TArray(&this->ParsedVertexDatas);
  this->missingTex = missing;
  TArray<int,_int>::Clear(&linemap);
  this->normMap = (FDynamicColormap *)0x0;
  this->fogMap = (FDynamicColormap *)0x0;
  return;
}

Assistant:

UDMFParser(FMissingTextureTracker &missing)
		: missingTex(missing)
	{
		linemap.Clear();
		fogMap = normMap = NULL;
	}